

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prefix.cpp
# Opt level: O1

Prefix * __thiscall
duckdb::Prefix::TransformToDeprecatedAppend
          (Prefix *__return_storage_ptr__,Prefix *this,ART *art,
          unsafe_unique_ptr<FixedSizeAllocator> *allocator,uint8_t byte)

{
  Node *pNVar1;
  undefined7 uVar2;
  IndexPointer IVar3;
  ulong uVar4;
  Prefix prefix;
  Prefix local_40;
  
  uVar4 = (ulong)this->data[0xf];
  if (uVar4 == 0xf) {
    IVar3 = FixedSizeAllocator::New
                      ((allocator->
                       super_unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
                       )._M_t.
                       super___uniq_ptr_impl<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_duckdb::FixedSizeAllocator_*,_std::default_delete<duckdb::FixedSizeAllocator>_>
                       .super__Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false>._M_head_impl);
    pNVar1 = this->ptr;
    (pNVar1->super_IndexPointer).data = (IVar3.data & 0xffffffffffffff) + 0x100000000000000;
    Prefix(&local_40,allocator,(Node)(pNVar1->super_IndexPointer).data,0xf);
    TransformToDeprecatedAppend(__return_storage_ptr__,&local_40,art,allocator,byte);
  }
  else {
    this->data[uVar4] = byte;
    this->data[0xf] = this->data[0xf] + '\x01';
    uVar2 = *(undefined7 *)&this->field_0x11;
    __return_storage_ptr__->in_memory = this->in_memory;
    *(undefined7 *)&__return_storage_ptr__->field_0x11 = uVar2;
    pNVar1 = this->ptr;
    __return_storage_ptr__->data = this->data;
    __return_storage_ptr__->ptr = pNVar1;
  }
  return __return_storage_ptr__;
}

Assistant:

Prefix Prefix::TransformToDeprecatedAppend(ART &art, unsafe_unique_ptr<FixedSizeAllocator> &allocator, uint8_t byte) {
	if (data[DEPRECATED_COUNT] != DEPRECATED_COUNT) {
		data[data[DEPRECATED_COUNT]] = byte;
		data[DEPRECATED_COUNT]++;
		return *this;
	}

	*ptr = allocator->New();
	ptr->SetMetadata(static_cast<uint8_t>(PREFIX));
	Prefix prefix(allocator, *ptr, DEPRECATED_COUNT);
	return prefix.TransformToDeprecatedAppend(art, allocator, byte);
}